

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_number.hpp
# Opt level: O1

type_conflict2 __thiscall
jsoncons::detail::from_integer<__int128,std::__cxx11::string>
          (detail *this,__int128 value,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *result)

{
  undefined1 auVar1 [16];
  assertion_error *this_00;
  char in_DL;
  type_conflict2 tVar2;
  ulong uVar3;
  type_conflict2 tVar4;
  ulong uVar5;
  byte *pbVar6;
  long lVar7;
  undefined1 auVar8 [16];
  char_type buf [255];
  string local_158;
  byte local_138 [264];
  
  auVar1._8_8_ = result;
  auVar1._0_8_ = this;
  if ((long)result < 0) {
    uVar3 = 0;
    do {
      uVar5 = auVar1._0_8_;
      auVar8 = __divti3(uVar5,auVar1._8_8_,10,0);
      tVar2 = uVar3 + 1;
      local_138[uVar3] = 0x30 - (auVar1[0] + auVar8[0] * -10);
      lVar7 = auVar1._8_8_ + ((ulong)(9 < uVar5) - 1);
      if (0xfd < uVar3) break;
      uVar3 = tVar2;
      auVar1 = auVar8;
    } while (lVar7 != -1 || lVar7 + 1U < (ulong)(uVar5 - 10 < 0xffffffffffffffed));
  }
  else {
    uVar3 = 0;
    do {
      lVar7 = auVar1._8_8_;
      uVar5 = auVar1._0_8_;
      auVar8 = __udivti3(uVar5,lVar7,10,0);
      tVar2 = uVar3 + 1;
      local_138[uVar3] = auVar1[0] + auVar8[0] * -10 | 0x30;
      if (0xfd < uVar3) break;
      uVar3 = tVar2;
      auVar1 = auVar8;
    } while (lVar7 != 0 || (ulong)-lVar7 < (ulong)(9 < uVar5));
  }
  if (tVar2 == 0xff) {
    this_00 = (assertion_error *)__cxa_allocate_exception(0x10);
    local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_158,"assertion \'p != last\' failed at  <> :0","");
    assertion_error::assertion_error(this_00,&local_158);
    __cxa_throw(this_00,&assertion_error::typeinfo,std::runtime_error::~runtime_error);
  }
  tVar4 = tVar2;
  if ((long)result < 0) {
    std::__cxx11::string::push_back(in_DL);
    tVar4 = tVar2 + 1;
  }
  for (pbVar6 = local_138 + (tVar2 - 1); local_138 <= pbVar6; pbVar6 = pbVar6 + -1) {
    std::__cxx11::string::push_back(in_DL);
  }
  return tVar4;
}

Assistant:

typename std::enable_if<ext_traits::is_integer<Integer>::value,std::size_t>::type
    from_integer(Integer value, Result& result)
    {
        using char_type = typename Result::value_type;

        char_type buf[255];
        char_type *p = buf;
        const char_type* last = buf+255;

        bool is_negative = value < 0;

        if (value < 0)
        {
            do
            {
                *p++ = static_cast<char_type>(48 - (value % 10));
            }
            while ((value /= 10) && (p < last));
        }
        else
        {

            do
            {
                *p++ = static_cast<char_type>(48 + value % 10);
            }
            while ((value /= 10) && (p < last));
        }
        JSONCONS_ASSERT(p != last);

        std::size_t count = (p - buf);
        if (is_negative)
        {
            result.push_back('-');
            ++count;
        }
        while (--p >= buf)
        {
            result.push_back(*p);
        }

        return count;
    }